

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void av1_tpl_preload_rc_estimate(AV1_COMP *cpi,EncodeFrameParams *frame_params)

{
  int iVar1;
  int *top_index_00;
  long in_RSI;
  long *in_RDI;
  AV1_COMP *unaff_retaddr;
  int gf_index;
  int top_index;
  int bottom_index;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  bool local_2d;
  uint local_2c;
  long *bottom_index_00;
  
  bottom_index_00 = in_RDI + 0x77f0;
  top_index_00 = (int *)(*in_RDI + 400);
  if ((int)in_RDI[0x13acb] == 0) {
    *(undefined1 *)bottom_index_00 = *(undefined1 *)(in_RSI + 4);
    for (local_2c = (uint)*(byte *)(in_RDI + 0xe258); (int)local_2c < top_index_00[0x61e];
        local_2c = local_2c + 1) {
      *(undefined1 *)bottom_index_00 =
           *(undefined1 *)((long)top_index_00 + (long)(int)local_2c + 0x1680);
      local_2d = false;
      if (*(char *)((long)top_index_00 + (long)(int)local_2c) != '\x03') {
        local_2d = *(char *)((long)top_index_00 + (long)(int)local_2c) != '\x06';
      }
      *(uint *)(bottom_index_00 + 0x3c) = (uint)local_2d;
      iVar1 = av1_rc_pick_q_and_bounds
                        (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                         (int)((ulong)in_RSI >> 0x20),(int *)bottom_index_00,top_index_00);
      top_index_00[(long)(int)local_2c + 0x2b2] = iVar1;
    }
  }
  return;
}

Assistant:

void av1_tpl_preload_rc_estimate(AV1_COMP *cpi,
                                 const EncodeFrameParams *const frame_params) {
  AV1_COMMON *cm = &cpi->common;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  int bottom_index, top_index;
  if (cpi->use_ducky_encode) return;

  cm->current_frame.frame_type = frame_params->frame_type;
  for (int gf_index = cpi->gf_frame_index; gf_index < gf_group->size;
       ++gf_index) {
    cm->current_frame.frame_type = gf_group->frame_type[gf_index];
    cm->show_frame = gf_group->update_type[gf_index] != ARF_UPDATE &&
                     gf_group->update_type[gf_index] != INTNL_ARF_UPDATE;
    gf_group->q_val[gf_index] = av1_rc_pick_q_and_bounds(
        cpi, cm->width, cm->height, gf_index, &bottom_index, &top_index);
  }
}